

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveCursorsOnList(BtCursor *p,Pgno iRoot,BtCursor *pExcept)

{
  int iVar1;
  BtCursor *in_RDX;
  Pgno in_ESI;
  BtCursor *in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  BtCursor *local_10;
  
  local_10 = in_RDI;
  do {
    if ((local_10 != in_RDX) && ((in_ESI == 0 || (local_10->pgnoRoot == in_ESI)))) {
      if ((local_10->eState == '\0') || (local_10->eState == '\x02')) {
        iVar1 = saveCursorPosition((BtCursor *)
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        if (iVar1 != 0) {
          return iVar1;
        }
        in_stack_ffffffffffffffdc = 0;
      }
      else {
        btreeReleaseAllCursorPages(in_RDX);
      }
    }
    local_10 = local_10->pNext;
  } while (local_10 != (BtCursor *)0x0);
  return 0;
}

Assistant:

static int SQLITE_NOINLINE saveCursorsOnList(
  BtCursor *p,         /* The first cursor that needs saving */
  Pgno iRoot,          /* Only save cursor with this iRoot. Save all if zero */
  BtCursor *pExcept    /* Do not save this cursor */
){
  do{
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ){
      if( p->eState==CURSOR_VALID || p->eState==CURSOR_SKIPNEXT ){
        int rc = saveCursorPosition(p);
        if( SQLITE_OK!=rc ){
          return rc;
        }
      }else{
        testcase( p->iPage>=0 );
        btreeReleaseAllCursorPages(p);
      }
    }
    p = p->pNext;
  }while( p );
  return SQLITE_OK;
}